

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O1

Literal_t * Rpo_Factorize(uint *target,int nVars,int nThreshold,int verbose)

{
  Literal_t *__ptr;
  int iVar1;
  ulong uVar2;
  Literal_t **vecLit;
  Literal_t *pLVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  undefined4 in_register_00000014;
  uint nLit;
  uint *puVar7;
  size_t __size;
  int iVar8;
  long lVar9;
  int thresholdCount;
  ulong local_40;
  undefined8 local_38;
  ulong uVar3;
  
  local_38 = CONCAT44(in_register_00000014,nThreshold);
  local_40 = (ulong)(uint)verbose;
  thresholdCount = 0;
  uVar2 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  uVar3 = uVar2;
  if (nVars < 6) {
    uVar2 = 1;
    uVar3 = uVar2;
  }
  do {
    iVar1 = (int)uVar2;
    if (iVar1 < 1) goto LAB_005e0011;
    lVar9 = uVar2 - 1;
    uVar2 = uVar2 - 1;
  } while (target[lVar9] == 0);
  if (iVar1 < 1) {
LAB_005e0011:
    pVVar5 = (Vec_Str_t *)malloc(0x10);
    pVVar5->nCap = 0x10;
    pVVar5->nSize = 0;
    pcVar6 = (char *)malloc(0x10);
    pVVar5->pArray = pcVar6;
    pVVar5->nSize = 1;
    *pcVar6 = '0';
  }
  else {
    do {
      iVar1 = (int)uVar3;
      if (iVar1 < 1) goto LAB_005e0040;
      lVar9 = uVar3 - 1;
      uVar3 = uVar3 - 1;
    } while (target[lVar9] == 0xffffffff);
    if (0 < iVar1) {
      if (verbose != 0) {
        puVar7 = target;
        Abc_Print((int)target,"Target: ");
        iVar1 = (int)puVar7;
        if (0 < nVars) {
          lVar9 = (ulong)(uint)nVars + 1;
          do {
            Abc_Print((int)puVar7,"%08X",(ulong)target[lVar9 + -2]);
            iVar1 = (int)puVar7;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        Abc_Print(iVar1,"\n");
      }
      __size = (long)(nVars * 2) << 3;
      vecLit = (Literal_t **)malloc(__size);
      iVar1 = (int)__size;
      if (nVars < 1) {
        nLit = 0;
      }
      else {
        iVar8 = nVars + 1;
        nLit = 0;
        do {
          pLVar4 = Lit_Alloc(target,nVars,iVar8 + -2,'+');
          if (pLVar4 != (Literal_t *)0x0) {
            vecLit[(int)nLit] = pLVar4;
            nLit = nLit + 1;
          }
          puVar7 = target;
          pLVar4 = Lit_Alloc(target,nVars,iVar8 + -2,'-');
          iVar1 = (int)puVar7;
          if (pLVar4 != (Literal_t *)0x0) {
            vecLit[(int)nLit] = pLVar4;
            nLit = nLit + 1;
          }
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
      iVar8 = (int)local_40;
      if (iVar8 != 0) {
        Abc_Print(iVar1,"Allocated %d literal clusters\n",(ulong)nLit);
      }
      pLVar4 = Rpo_Recursion(target,vecLit,nLit,nLit,nVars,&thresholdCount,(int)local_38,iVar8);
      if (0 < (int)nLit) {
        uVar2 = 0;
        do {
          __ptr = vecLit[uVar2];
          if (__ptr != (Literal_t *)0x0) {
            if (__ptr->function != (uint *)0x0) {
              free(__ptr->function);
              __ptr->function = (uint *)0x0;
            }
            if (__ptr->transition != (uint *)0x0) {
              free(__ptr->transition);
              __ptr->transition = (uint *)0x0;
            }
            pVVar5 = __ptr->expression;
            if (pVVar5->pArray != (char *)0x0) {
              free(pVVar5->pArray);
              pVVar5->pArray = (char *)0x0;
            }
            if (pVVar5 != (Vec_Str_t *)0x0) {
              free(pVVar5);
            }
            free(__ptr);
          }
          uVar2 = uVar2 + 1;
        } while (nLit != uVar2);
      }
      if (vecLit == (Literal_t **)0x0) {
        return pLVar4;
      }
      free(vecLit);
      return pLVar4;
    }
LAB_005e0040:
    pVVar5 = (Vec_Str_t *)malloc(0x10);
    pVVar5->nCap = 0x10;
    pVVar5->nSize = 0;
    pcVar6 = (char *)malloc(0x10);
    pVVar5->pArray = pcVar6;
    pVVar5->nSize = 1;
    *pcVar6 = '1';
  }
  pVVar5->nSize = 2;
  pcVar6[1] = '\0';
  pLVar4 = (Literal_t *)malloc(0x18);
  pLVar4->expression = pVVar5;
  pLVar4->function = target;
  pLVar4->transition = target;
  return pLVar4;
}

Assistant:

Literal_t* Rpo_Factorize(unsigned* target, int nVars, int nThreshold, int verbose) {

    int nLitCap = nVars * 2;
    int nLit = 0;
    int w;
    Literal_t** vecLit;
    Literal_t* lit;
    Literal_t* result;
    int thresholdCount = 0;

    if (Kit_TruthIsConst0(target, nVars)) {
        return Lit_CreateLiteralConst(target, nVars, 0);
    } else if (Kit_TruthIsConst1(target, nVars)) {
        return Lit_CreateLiteralConst(target, nVars, 1);
    }

    //    if (nThreshold == -1) {
    //        nThreshold = nLitCap + nVars;
    //    }
    if (verbose) {
        Abc_Print(-2, "Target: ");
        Lit_PrintTT(target, nVars);
        Abc_Print(-2, "\n");
    }
    vecLit = ABC_ALLOC(Literal_t*, nLitCap);

    for (w = nVars - 1; w >= 0; w--) {
        lit = Lit_Alloc(target, nVars, w, '+');
        if (lit != NULL) {
            vecLit[nLit] = lit;
            nLit++;
        }
        lit = Lit_Alloc(target, nVars, w, '-');
        if (lit != NULL) {
            vecLit[nLit] = lit;
            nLit++;
        }
    }
    if (verbose) {
        Abc_Print(-2, "Allocated %d literal clusters\n", nLit);
    }

    result = Rpo_Recursion(target, vecLit, nLit, nLit, nVars, &thresholdCount, nThreshold, verbose);

    //freeing the memory
    for (w = 0; w < nLit; ++w) {
        Lit_Free(vecLit[w]);
    }
    ABC_FREE(vecLit);

    return result;

}